

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_precision.cpp
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_66499::find_lowerable_rvalues_visitor::visit_leave
          (find_lowerable_rvalues_visitor *this,ir_assignment *ir)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  set_entry *psVar4;
  long lVar3;
  
  ir_hierarchical_visitor::visit_leave(&this->super_ir_hierarchical_visitor,ir);
  iVar2 = (*(ir->lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[8])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  if ((*(uint *)(lVar3 + 0x40) & 0xf000) == 0xb000) {
    psVar4 = _mesa_set_search(this->lowerable_rvalues,ir->rhs);
    if (psVar4 == (set_entry *)0x0) {
      if ((ir->rhs != (ir_rvalue *)0x0) &&
         ((ir->rhs->super_ir_instruction).ir_type == ir_type_constant)) {
        return visit_continue;
      }
      uVar1 = (ushort)*(undefined4 *)(lVar3 + 0x44) & 0xff9f | 0x20;
    }
    else {
      if ((*(ushort *)(lVar3 + 0x44) & 0x60) != 0) {
        return visit_continue;
      }
      uVar1 = *(ushort *)(lVar3 + 0x44) | 0x40;
    }
    *(ushort *)(lVar3 + 0x44) = uVar1;
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
find_lowerable_rvalues_visitor::visit_leave(ir_assignment *ir)
{
   ir_hierarchical_visitor::visit_leave(ir);

   /* Special case for handling temporary variables generated by the compiler.
    * If we assign to one of these using a lowered precision then we can assume
    * the temporary variable should have a medium precision too.
    */
   ir_variable *var = ir->lhs->variable_referenced();

   if (var->data.mode == ir_var_temporary) {
      if (_mesa_set_search(lowerable_rvalues, ir->rhs)) {
         /* Only override the precision if this is the first assignment. For
          * temporaries such as the ones generated for the ?: operator there
          * can be multiple assignments with different precisions. This way we
          * get the highest precision of all of the assignments.
          */
         if (var->data.precision == GLSL_PRECISION_NONE)
            var->data.precision = GLSL_PRECISION_MEDIUM;
      } else if (!ir->rhs->as_constant()) {
         var->data.precision = GLSL_PRECISION_HIGH;
      }
   }

   return visit_continue;
}